

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFourAction::Pick(BlueRoomFourAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  BlueRoomFourAction *local_18;
  BlueRoomFourAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if ((iVar1 != WHITE_PILLAR) &&
     (iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands), iVar1 != BLACK_PILLAR
     )) {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == ROPE) {
      pAVar2 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,
                 "You attempt to pickup the rope, but it appears to be attached to the floor in the middle of the room. There seems to be enough to extend toward each pillar."
                 ,&local_71);
      ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_70);
      this_local = (BlueRoomFourAction *)pAVar2;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      return (ActionResults *)this_local;
    }
    pAVar2 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
    return pAVar2;
  }
  pAVar2 = (ActionResults *)operator_new(0x30);
  local_4d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"You can\'t pick up that pillar!",&local_39);
  ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_38);
  local_4d = 0;
  this_local = (BlueRoomFourAction *)pAVar2;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *BlueRoomFourAction::Pick() {

    if(commands->getMainItem() == WHITE_PILLAR || commands->getMainItem() == BLACK_PILLAR)
    {
        return new ActionResults(CURRENT,"You can't pick up that pillar!");
    } else if (commands->getMainItem() == ROPE){
        return new ActionResults(CURRENT, "You attempt to pickup the rope, but it appears to be attached to the floor in the middle of the room. "
                "There seems to be enough to extend toward each pillar.");
    } else {
        return AbstractRoomAction::Pick();
    }
}